

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

bov_text_t * bov_text_update(bov_text_t *text,GLubyte *string)

{
  long lVar1;
  GLsizei GVar2;
  size_t sVar3;
  GLfloat *pGVar4;
  bov_text_t *pbVar5;
  int iVar6;
  GLenum extraout_EDX;
  int extraout_EDX_00;
  GLubyte *pGVar7;
  void *__size;
  bov_text_t *pbVar8;
  int iVar9;
  
  pGVar7 = string;
  sVar3 = strlen((char *)string);
  iVar9 = (int)sVar3;
  if (text->dataCapacity < iVar9) {
    free(text->data);
    __size = (void *)((long)iVar9 * 0x60);
    pGVar4 = (GLfloat *)malloc((size_t)__size);
    text->data = pGVar4;
    if (pGVar4 == (GLfloat *)0x0) {
      bov_text_update_cold_1();
      iVar9 = (int)pGVar7;
      pbVar8 = (bov_text_t *)0x50;
      pbVar5 = (bov_text_t *)malloc(0x50);
      if (pbVar5 != (bov_text_t *)0x0) {
        iVar6 = iVar9;
        if (__size == (void *)0x0) {
          iVar6 = 0;
        }
        pbVar5->vboLen = iVar6;
        *(undefined8 *)&pbVar5->dataCapacity = 0;
        pbVar5->data = (GLfloat *)0x3f80000000000000;
        (pbVar5->param).fillColor[0] = 1.0;
        (pbVar5->param).fillColor[1] = 1.0;
        (pbVar5->param).fillColor[2] = 1.0;
        (pbVar5->param).fillColor[3] = 1.0;
        (pbVar5->param).outlineColor[0] = 0.0;
        (pbVar5->param).outlineColor[1] = 0.0;
        (pbVar5->param).outlineColor[2] = 1.0;
        (pbVar5->param).outlineColor[3] = 1.0;
        (pbVar5->param).pos[0] = 0.025;
        (pbVar5->param).pos[1] = 0.0;
        (pbVar5->param).shift[0] = -1.0;
        (pbVar5->param).shift[1] = 0.0;
        (*glad_glGenVertexArrays)(1,(GLuint *)pbVar5);
        (*glad_glBindVertexArray)(pbVar5->vao);
        (*glad_glGenBuffers)(1,&pbVar5->vbo);
        (*glad_glBindBuffer)(0x8892,pbVar5->vbo);
        (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(0);
        (*glad_glBufferData)(0x8892,(long)iVar9 * 8,__size,extraout_EDX);
        pbVar5->vboCapacity = iVar9;
        return pbVar5;
      }
      bov_points_new_cold_1();
      iVar9 = 0;
      if (pGVar7 != (GLubyte *)0x0) {
        iVar9 = extraout_EDX_00;
      }
      pbVar8->vboLen = iVar9;
      (*glad_glBindBuffer)(0x8892,pbVar8->vbo);
      if (pbVar8->vboCapacity < extraout_EDX_00) {
        (*glad_glBufferData)(0x8892,(long)extraout_EDX_00 << 3,pGVar7,0x88e8);
        pbVar8->vboCapacity = extraout_EDX_00;
      }
      else if (pGVar7 != (GLubyte *)0x0) {
        (*glad_glBufferSubData)(0x8892,0,(long)extraout_EDX_00 << 3,pGVar7);
      }
      return pbVar8;
    }
    text->dataCapacity = iVar9;
  }
  GVar2 = fill_text_data(text->data,string,iVar9);
  text->vboLen = GVar2;
  (*glad_glBindBuffer)(0x8892,text->vbo);
  lVar1 = (long)text->vboLen * 0x60;
  if (text->vboCapacity < text->vboLen) {
    (*glad_glBufferData)(0x8892,lVar1,text->data,0x88e8);
    text->vboCapacity = text->vboLen;
  }
  else {
    (*glad_glBufferSubData)(0x8892,0,lVar1,text->data);
  }
  return text;
}

Assistant:

bov_text_t* bov_text_update(bov_text_t* text, const GLubyte* string)
{
	// see if the length is not longer than the original string
	GLsizei newLen = (GLsizei) strlen((const char*)string);

	if(newLen > text->dataCapacity) {
		free(text->data);
		text->data = malloc(sizeof(GLfloat) * 24 * newLen);
		CHECK_MALLOC(text->data);
		text->dataCapacity = newLen;
	}


	// text->string = string;
	text->vboLen = fill_text_data(text->data, string, newLen);

	glBindBuffer(GL_ARRAY_BUFFER, text->vbo);
	if(text->vboLen > text->vboCapacity) {
		glBufferData(GL_ARRAY_BUFFER,
		             sizeof(GLfloat) * 24 * text->vboLen,
		             text->data,
		             GL_DYNAMIC_DRAW);
		text->vboCapacity = text->vboLen;
	}
	else{
		glBufferSubData(GL_ARRAY_BUFFER,
		                0,
		                sizeof(GLfloat) * 24 * text->vboLen,
		                text->data);
	}

	return text;
}